

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,true,256ul>>
::findImpl<axl::sl::PtrIterator<char_const,true>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,true,256ul>>
           *this,PtrIterator<const_char,_true> *accessor,size_t i0,size_t length)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t unaff_R15;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  
  lVar2 = *(long *)(this + 0x10);
  lVar1 = lVar2 + -1;
  uVar8 = lVar2 + -1 + i0;
  do {
    if (length <= uVar8) {
      return uVar8 - lVar1;
    }
    cVar6 = accessor->m_p[-uVar8];
    bVar12 = cVar6 == *(char *)(*(long *)this + lVar1);
    lVar9 = lVar1;
    if (bVar12) {
      sVar4 = (uVar8 - lVar2) + 1;
      sVar10 = sVar4;
      if (lVar1 != 0) {
        lVar7 = -uVar8;
        lVar9 = lVar2 + -2;
        do {
          lVar7 = lVar7 + 1;
          cVar6 = accessor->m_p[lVar7];
          bVar12 = cVar6 == *(char *)(*(long *)this + lVar9);
          if (!bVar12) {
            uVar8 = -lVar7;
            goto LAB_0012238b;
          }
          bVar11 = lVar9 != 0;
          lVar9 = lVar9 + -1;
        } while (bVar11);
      }
    }
    else {
LAB_0012238b:
      uVar3 = *(ulong *)(*(long *)(this + 0x18) + ((ulong)(long)cVar6 % *(ulong *)(this + 0x28)) * 8
                        );
      uVar5 = *(ulong *)(*(long *)(this + 0x30) + lVar9 * 8);
      if (uVar5 < uVar3) {
        uVar5 = uVar3;
      }
      sVar4 = uVar5 + uVar8;
      sVar10 = unaff_R15;
    }
    uVar8 = sVar4;
    unaff_R15 = sVar10;
    if (bVar12) {
      return sVar10;
    }
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}